

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flFTP.cpp
# Opt level: O0

int __thiscall Rainbow::flFTP::JoinServer(flFTP *this,string *host,string *service)

{
  int iVar1;
  string *in_RDX;
  string *in_RSI;
  long in_RDI;
  char message [512];
  int ret;
  string *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd38;
  CommPort *in_stack_fffffffffffffd40;
  allocator<char> *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  undefined1 local_278 [8];
  string *in_stack_fffffffffffffd90;
  string *in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffda4;
  size_t in_stack_fffffffffffffda8;
  void *in_stack_fffffffffffffdb0;
  CommPort *in_stack_fffffffffffffdb8;
  string local_60 [32];
  string local_40 [32];
  string *local_20;
  string *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x70),in_RSI);
  std::unique_ptr<Rainbow::CommPort,_std::default_delete<Rainbow::CommPort>_>::operator->
            ((unique_ptr<Rainbow::CommPort,_std::default_delete<Rainbow::CommPort>_> *)0x13125e);
  std::__cxx11::string::string(local_40,local_18);
  std::__cxx11::string::string(local_60,local_20);
  iVar1 = CommPort::Connect(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                            in_stack_fffffffffffffd30);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  if (iVar1 < 0) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0xd0),"connection failed");
    local_4 = -1;
  }
  else {
    memset(local_278,0,0x200);
    std::unique_ptr<Rainbow::CommPort,_std::default_delete<Rainbow::CommPort>_>::operator->
              ((unique_ptr<Rainbow::CommPort,_std::default_delete<Rainbow::CommPort>_> *)0x13136a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    iVar1 = CommPort::Recv(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                           in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,
                           in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd68);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd67);
    if (iVar1 < 0) {
      local_4 = -1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int flFTP::JoinServer(const std::string &host, const std::string &service)
	{
		_host = host;
		if(_commPort->Connect(host, service) < 0)
		{
			_errorMessage = "connection failed";
			return -1;
		}
		int ret;
		char message[BUFFER] = { 0 };

		ret = _commPort->Recv(message, BUFFER - 1, 0, FTP_SERVER_READY_OK, _errorMessage);
		if(ret < 0)
		{
			return -1;
		}

		return 0;
	}